

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_simplicial_complex.h
# Opt level: O0

Proximity_graph<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_> * __thiscall
Gudhi::
compute_proximity_graph<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,boost::integer_range<unsigned_long>,main::__1>
          (Proximity_graph<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *__return_storage_ptr__,Gudhi *this,integer_range<unsigned_long> *points,
          Filtration_value threshold,anon_class_8_1_2a9879be distance)

{
  pointer *this_00;
  type_conflict4 tVar1;
  reference j;
  iterator first;
  iterator last;
  iterator ep_iter;
  reference rVar2;
  double local_140;
  integer_iterator<unsigned_long> local_138 [2];
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_128;
  integer_iterator<unsigned_long> local_118;
  vertex_iterator vi_end;
  vertex_iterator vi;
  type *local_100;
  type vertex_prop;
  value_type local_c8;
  value_type local_c0;
  type it_v;
  value_type local_a0;
  integer_iterator<unsigned_long> it_u;
  int local_90;
  Filtration_value fil;
  Vertex_handle idx_v;
  Vertex_handle idx_u;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> vertices;
  vector<float,_std::allocator<float>_> edges_fil;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges;
  Filtration_value threshold_local;
  integer_range<unsigned_long> *points_local;
  anon_class_8_1_2a9879be distance_local;
  Proximity_graph<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_> *skel_graph;
  
  points_local = points;
  distance_local.distances = (Distance_matrix *)__return_storage_ptr__;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &edges_fil.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::map
            ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
             &idx_v);
  fil = 0.0;
  local_a0 = (value_type)
             boost::iterator_range_detail::
             iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
             ::begin((iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
                      *)this);
  while( true ) {
    it_v.m_value = (value_type)
                   boost::iterator_range_detail::
                   iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
                   ::end((iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
                          *)this);
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_a0,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&it_v);
    if (!tVar1) break;
    local_90 = (int)fil + 1;
    local_c0 = (value_type)
               boost::iterators::operator+
                         ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                           *)&local_a0,1);
    while( true ) {
      local_c8 = (value_type)
                 boost::iterator_range_detail::
                 iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
                 ::end((iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
                        *)this);
      tVar1 = boost::iterators::operator!=
                        ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                          *)&local_c0,
                         (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                          *)&local_c8);
      if (!tVar1) break;
      rVar2 = boost::iterators::detail::
              iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                           *)&local_a0);
      j = boost::iterators::detail::
          iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
          ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                       *)&local_c0);
      it_u.m_value._4_4_ =
           main::anon_class_8_1_2a9879be::operator()
                     ((anon_class_8_1_2a9879be *)&points_local,rVar2,j);
      if (it_u.m_value._4_4_ <= threshold) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &edges_fil.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(int *)&fil,&local_90);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &vertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (value_type_conflict3 *)((long)&it_u.m_value + 4));
      }
      boost::iterators::detail::
      iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                    *)&local_c0);
      local_90 = local_90 + 1;
    }
    fil = (Filtration_value)((int)fil + 1);
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&local_a0);
  }
  this_00 = &edges_fil.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  ep_iter = std::vector<float,_std::allocator<float>_>::begin
                      ((vector<float,_std::allocator<float>_> *)
                       &vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  boost::
  adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>
  ::
  adjacency_list<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>
              *)__return_storage_ptr__,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )last._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             ep_iter._M_current,(long)(int)fil,0,(no_property *)&vertex_prop.field_0xf);
  local_100 = boost::
              get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>::config>,Gudhi::vertex_filtration_t>
                        (__return_storage_ptr__);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&vi_end);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&local_118);
  local_128 = boost::
              vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>::config>>
                        ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                          *)__return_storage_ptr__);
  std::
  tie<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>
            (local_138,&vi_end);
  std::
  tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&>
  ::operator=((tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&>
               *)local_138,&local_128);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&vi_end,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_118);
    if (!tVar1) break;
    rVar2 = boost::iterators::detail::
            iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                         *)&vi_end);
    local_140 = 0.0;
    boost::
    put<boost::vec_adj_list_vertex_property_map<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::property<Gudhi::vertex_filtration_t,float,boost::no_property>,boost::property<Gudhi::edge_filtration_t,float,boost::no_property>,boost::no_property,boost::listS>*,float,float&,Gudhi::vertex_filtration_t>,float&,unsigned_long,double>
              ((put_get_helper<float_&,_boost::vec_adj_list_vertex_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_float,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>_*,_float,_float_&,_Gudhi::vertex_filtration_t>_>
                *)&local_100,rVar2,&local_140);
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&vi_end);
  }
  std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
            ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
             &idx_v);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &edges_fil.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Proximity_graph<SimplicialComplexForProximityGraph> compute_proximity_graph(
    const ForwardPointRange& points,
    typename SimplicialComplexForProximityGraph::Filtration_value threshold,
    Distance distance) {
  using Vertex_handle = typename SimplicialComplexForProximityGraph::Vertex_handle;
  using Filtration_value = typename SimplicialComplexForProximityGraph::Filtration_value;

  std::vector<std::pair< Vertex_handle, Vertex_handle >> edges;
  std::vector< Filtration_value > edges_fil;
  std::map< Vertex_handle, Filtration_value > vertices;

  Vertex_handle idx_u, idx_v;
  Filtration_value fil;
  idx_u = 0;
  for (auto it_u = points.begin(); it_u != points.end(); ++it_u) {
    idx_v = idx_u + 1;
    for (auto it_v = it_u + 1; it_v != points.end(); ++it_v, ++idx_v) {
      fil = distance(*it_u, *it_v);
      if (fil <= threshold) {
        edges.emplace_back(idx_u, idx_v);
        edges_fil.push_back(fil);
      }
    }
    ++idx_u;
  }

  // Points are labeled from 0 to idx_u-1
  Proximity_graph<SimplicialComplexForProximityGraph> skel_graph(edges.begin(), edges.end(), edges_fil.begin(), idx_u);

  auto vertex_prop = boost::get(vertex_filtration_t(), skel_graph);

  typename boost::graph_traits<Proximity_graph<SimplicialComplexForProximityGraph>>::vertex_iterator vi, vi_end;
  for (std::tie(vi, vi_end) = boost::vertices(skel_graph);
       vi != vi_end; ++vi) {
    boost::put(vertex_prop, *vi, 0.);
  }

  return skel_graph;
}